

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O2

string * ClientUtils::AdaptDeviceName
                   (string *__return_storage_ptr__,string *i_rDeviceName,uint i_DeviceID)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint local_f4;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  
  local_f4 = i_DeviceID;
  if (i_rDeviceName->_M_string_length == 0) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (&local_f0,"Unnamed Device %d");
    this = boost::io::detail::
           feed<char,std::char_traits<char>,std::allocator<char>,unsigned_int_const&>
                     (&local_f0,&local_f4);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (__return_storage_ptr__,this);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
              (&local_f0);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)i_rDeviceName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AdaptDeviceName( const std::string & i_rDeviceName, 
                               const unsigned int  i_DeviceID )
  {
    if( !i_rDeviceName.empty() )
    {
      return i_rDeviceName;
    }
    else
    {
      return str( boost::format( "Unnamed Device %d" ) % i_DeviceID );
    }
  }